

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void randomx::initCache(randomx_cache *cache,void *key,size_t keySize)

{
  uint32_t uVar1;
  Instruction *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined8 *in_RDI;
  uint64_t rcp;
  Instruction *instr;
  uint j;
  int i;
  Blake2Generator gen;
  int inputsValid;
  argon2_context context;
  argon2_instance_t instance;
  uint32_t segment_length;
  uint32_t memory_blocks;
  Blake2Generator *in_stack_00000868;
  SuperscalarProgram *in_stack_00000870;
  undefined4 in_stack_fffffffffffffea8;
  uint32_t in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  size_t in_stack_fffffffffffffec0;
  void *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  uint uVar2;
  uint pc;
  undefined4 in_stack_fffffffffffffed4;
  int iVar3;
  argon2_context *in_stack_ffffffffffffff00;
  argon2_instance_t *in_stack_ffffffffffffff08;
  argon2_context local_d8;
  undefined8 local_60;
  uint32_t local_58;
  uint32_t local_54;
  uint local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  undefined4 local_3c;
  undefined8 local_28;
  uint local_20;
  uint local_1c;
  undefined8 *local_8;
  
  local_d8.out = (uint8_t *)0x0;
  local_d8.outlen = 0;
  local_d8.salt = "RandomX-Kulupu\x01";
  local_d8.saltlen = 0xf;
  local_d8.secret = (uint8_t *)0x0;
  local_d8.secretlen = 0;
  local_d8.ad = (uint8_t *)0x0;
  local_d8.adlen = 0;
  local_d8.t_cost = 3;
  local_d8.m_cost = 0x40000;
  local_d8.lanes = 1;
  local_d8.threads = 1;
  local_d8.allocate_cbk = (allocate_fptr)0x0;
  local_d8.free_cbk = (deallocate_fptr)0x0;
  local_d8.flags = 0;
  local_d8.version = 0x13;
  local_8 = in_RDI;
  randomx_argon2_validate_inputs(&local_d8);
  local_1c = local_d8.m_cost;
  local_4c = local_d8.m_cost / (local_d8.lanes << 2);
  local_58 = local_d8.version;
  local_54 = local_d8.t_cost;
  local_50 = local_d8.m_cost;
  local_48 = local_4c << 2;
  local_44 = local_d8.lanes;
  local_40 = local_d8.threads;
  local_3c = 0;
  local_60 = *local_8;
  local_28 = local_8[0x1074];
  if (local_d8.lanes < local_d8.threads) {
    local_40 = local_d8.lanes;
  }
  local_20 = local_4c;
  randomx_argon2_initialize(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  randomx_argon2_fill_memory_blocks
            ((argon2_instance_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14a4dc);
  Blake2Generator::Blake2Generator
            ((Blake2Generator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  for (iVar3 = 0; iVar3 < 8; iVar3 = iVar3 + 1) {
    generateSuperscalar(in_stack_00000870,in_stack_00000868);
    uVar2 = 0;
    while( true ) {
      pc = uVar2;
      uVar1 = SuperscalarProgram::getSize((SuperscalarProgram *)(local_8 + (long)iVar3 * 0x20d + 5))
      ;
      if (uVar1 <= uVar2) break;
      this = SuperscalarProgram::operator()
                       ((SuperscalarProgram *)(local_8 + (long)iVar3 * 0x20d + 5),pc);
      if (this->opcode == '\r') {
        uVar1 = Instruction::getImm32((Instruction *)0x14a5ae);
        this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  randomx_reciprocal((ulong)uVar1);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_8 + 0x106d));
        Instruction::setImm32(this,in_stack_fffffffffffffeac);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (this_00,(value_type_conflict *)CONCAT44(uVar2,in_stack_fffffffffffffeb8));
      }
      uVar2 = pc + 1;
    }
  }
  return;
}

Assistant:

void initCache(randomx_cache* cache, const void* key, size_t keySize) {
		uint32_t memory_blocks, segment_length;
		argon2_instance_t instance;
		argon2_context context;

		context.out = nullptr;
		context.outlen = 0;
		context.pwd = CONST_CAST(uint8_t *)key;
		context.pwdlen = (uint32_t)keySize;
		context.salt = CONST_CAST(uint8_t *)RANDOMX_ARGON_SALT;
		context.saltlen = (uint32_t)randomx::ArgonSaltSize;
		context.secret = NULL;
		context.secretlen = 0;
		context.ad = NULL;
		context.adlen = 0;
		context.t_cost = RANDOMX_ARGON_ITERATIONS;
		context.m_cost = RANDOMX_ARGON_MEMORY;
		context.lanes = RANDOMX_ARGON_LANES;
		context.threads = 1;
		context.allocate_cbk = NULL;
		context.free_cbk = NULL;
		context.flags = ARGON2_DEFAULT_FLAGS;
		context.version = ARGON2_VERSION_NUMBER;

		int inputsValid = randomx_argon2_validate_inputs(&context);
		assert(inputsValid == ARGON2_OK);

		/* 2. Align memory size */
		/* Minimum memory_blocks = 8L blocks, where L is the number of lanes */
		memory_blocks = context.m_cost;

		segment_length = memory_blocks / (context.lanes * ARGON2_SYNC_POINTS);

		instance.version = context.version;
		instance.memory = NULL;
		instance.passes = context.t_cost;
		instance.memory_blocks = memory_blocks;
		instance.segment_length = segment_length;
		instance.lane_length = segment_length * ARGON2_SYNC_POINTS;
		instance.lanes = context.lanes;
		instance.threads = context.threads;
		instance.type = Argon2_d;
		instance.memory = (block*)cache->memory;
		instance.impl = cache->argonImpl;

		if (instance.threads > instance.lanes) {
			instance.threads = instance.lanes;
		}

		/* 3. Initialization: Hashing inputs, allocating memory, filling first
		 * blocks
		 */
		randomx_argon2_initialize(&instance, &context);

		randomx_argon2_fill_memory_blocks(&instance);

		cache->reciprocalCache.clear();
		randomx::Blake2Generator gen(key, keySize);
		for (int i = 0; i < RANDOMX_CACHE_ACCESSES; ++i) {
			randomx::generateSuperscalar(cache->programs[i], gen);
			for (unsigned j = 0; j < cache->programs[i].getSize(); ++j) {
				auto& instr = cache->programs[i](j);
				if ((SuperscalarInstructionType)instr.opcode == SuperscalarInstructionType::IMUL_RCP) {
					auto rcp = randomx_reciprocal(instr.getImm32());
					instr.setImm32(cache->reciprocalCache.size());
					cache->reciprocalCache.push_back(rcp);
				}
			}
		}
	}